

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int avx512_array_container_to_uint32_array
              (void *vout,uint16_t *array,size_t cardinality,uint32_t base)

{
  ulong uVar1;
  uint32_t *out;
  int *piVar2;
  long lVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  
  auVar4 = vpbroadcastd_avx512f();
  lVar3 = 0;
  uVar1 = 0;
  while (uVar1 + 0x10 <= cardinality) {
    auVar5 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(array + uVar1));
    auVar5 = vpaddd_avx512f(auVar4,auVar5);
    auVar5 = vmovdqu64_avx512f(auVar5);
    *(undefined1 (*) [64])((long)vout + (lVar3 >> 0x1e)) = auVar5;
    lVar3 = lVar3 + 0x1000000000;
    uVar1 = uVar1 + 0x10;
  }
  piVar2 = (int *)((long)vout + (long)(int)uVar1 * 4);
  for (; uVar1 < cardinality; uVar1 = uVar1 + 1) {
    *piVar2 = array[uVar1] + base;
    piVar2 = piVar2 + 1;
  }
  return (int)uVar1;
}

Assistant:

int avx512_array_container_to_uint32_array(void *vout, const uint16_t *array,
                                           size_t cardinality, uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    size_t i = 0;
    for (; i + sizeof(__m256i) / sizeof(uint16_t) <= cardinality;
         i += sizeof(__m256i) / sizeof(uint16_t)) {
        __m256i vinput = _mm256_loadu_si256((const __m256i *)(array + i));
        __m512i voutput = _mm512_add_epi32(_mm512_cvtepu16_epi32(vinput),
                                           _mm512_set1_epi32(base));
        _mm512_storeu_si512((__m512i *)(out + outpos), voutput);
        outpos += sizeof(__m512i) / sizeof(uint32_t);
    }
    for (; i < cardinality; ++i) {
        const uint32_t val = base + array[i];
        memcpy(out + outpos, &val,
               sizeof(uint32_t));  // should be compiled as a MOV on x64
        outpos++;
    }
    return outpos;
}